

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_local_time<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  bool bVar1;
  size_t sVar2;
  local_time_type x;
  value_type *pvVar3;
  region *prVar4;
  error_type *this;
  basic_value<toml::type_config> *v;
  error_info *v_00;
  basic_value<toml::type_config> *ctx_00;
  local_time_format_info fmt;
  result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
  val_fmt_reg;
  location first;
  type reg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3d8;
  result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
  local_3c0;
  location local_330;
  region local_2e8;
  region local_280;
  undefined1 local_218 [88];
  basic_value<toml::type_config> local_1c0;
  basic_value<toml::type_config> local_f8;
  
  location::location(&local_330,loc);
  parse_local_time_only<toml::type_config>(&local_3c0,loc,ctx);
  if (local_3c0.is_ok_ == false) {
    this = result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
           ::unwrap_err(&local_3c0,(source_location)0x46a448);
    err<toml::error_info&>((failure<toml::error_info> *)local_218,(toml *)this,v_00);
    ctx_00 = (basic_value<toml::type_config> *)local_218;
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (__return_storage_ptr__,(failure_type *)local_218);
    error_info::~error_info((error_info *)local_218);
  }
  else {
    pvVar3 = result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
             ::unwrap(&local_3c0,(source_location)0x46a460);
    x = (pvVar3->
        super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
        ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl;
    pvVar3 = result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
             ::unwrap(&local_3c0,(source_location)0x46a478);
    bVar1 = (pvVar3->
            super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
            ).super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
            super__Head_base<1UL,_toml::local_time_format_info,_false>._M_head_impl.has_seconds;
    sVar2 = (pvVar3->
            super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
            ).super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
            super__Head_base<1UL,_toml::local_time_format_info,_false>._M_head_impl.
            subsecond_precision;
    prVar4 = (region *)
             result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
             ::unwrap(&local_3c0,(source_location)0x46a490);
    region::region(&local_280,prVar4);
    local_3d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    region::region(&local_2e8,&local_280);
    fmt._1_7_ = 0;
    fmt.has_seconds = bVar1;
    fmt.subsecond_precision = sVar2;
    basic_value<toml::type_config>::basic_value
              ((basic_value<toml::type_config> *)(local_218 + 0x58),x,fmt,&local_3d8,&local_2e8);
    ok<toml::basic_value<toml::type_config>>
              ((success<toml::basic_value<toml::type_config>_> *)&local_f8,
               (toml *)(local_218 + 0x58),v);
    ctx_00 = &local_f8;
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (__return_storage_ptr__,(success_type *)ctx_00);
    basic_value<toml::type_config>::~basic_value(&local_f8);
    basic_value<toml::type_config>::~basic_value
              ((basic_value<toml::type_config> *)(local_218 + 0x58));
    region::~region(&local_2e8);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_3d8);
    region::~region(&local_280);
  }
  result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
  ::cleanup(&local_3c0,(EVP_PKEY_CTX *)ctx_00);
  location::~location(&local_330);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_local_time(location& loc, const context<TC>& ctx)
{
    const auto first = loc;

    auto val_fmt_reg = parse_local_time_only(loc, ctx);
    if(val_fmt_reg.is_err())
    {
        return err(val_fmt_reg.unwrap_err());
    }

    auto val = std::move(std::get<0>(val_fmt_reg.unwrap()));
    auto fmt = std::move(std::get<1>(val_fmt_reg.unwrap()));
    auto reg = std::move(std::get<2>(val_fmt_reg.unwrap()));

    return ok(basic_value<TC>(std::move(val), std::move(fmt), {}, std::move(reg)));
}